

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O2

void __thiscall OpenMD::ZConstraintForceModifier::doHarmonic(ZConstraintForceModifier *this)

{
  Molecule *pMVar1;
  RealType rp;
  double dVar2;
  RealType RVar3;
  _List_node_base *p_Var4;
  pointer ppSVar5;
  StuntDouble *pSVar6;
  pointer ppMVar7;
  _List_node_base *p_Var8;
  undefined4 uVar9;
  Vector3d force;
  Vector3d com_1;
  Vector3d d;
  Vector3d com;
  double local_108;
  undefined1 local_f8 [16];
  Vector<double,_3U> local_d0;
  double local_b8;
  undefined8 uStack_b0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  local_90.data_[0] = 0.0;
  Vector<double,_3U>::Vector(&local_60,local_90.data_);
  Vector<double,_3U>::Vector(&local_d0,&local_60);
  Vector<double,_3U>::Vector(&local_60);
  rp = Snapshot::getPotentialEnergy(this->currSnapshot_);
  Snapshot::setRawPotential(this->currSnapshot_,rp);
  local_108 = 0.0;
  local_f8 = ZEXT816(0);
  p_Var8 = (_List_node_base *)&this->movingZMols_;
  while (p_Var8 = (((_List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                   &p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var8 != (_List_node_base *)&this->movingZMols_) {
    pMVar1 = (Molecule *)p_Var8[1]._M_next;
    Molecule::getCom((Vector3d *)&local_90,pMVar1);
    p_Var4 = (_List_node_base *)&p_Var8[1]._M_prev;
    if (this->usingSMD_ != false) {
      p_Var4 = p_Var8 + 4;
    }
    p_Var4 = p_Var4->_M_next;
    Vector<double,_3U>::Vector(&local_a8);
    local_a8.data_[0] = 0.0;
    local_a8.data_[1] = 0.0;
    local_a8.data_[2] = (double)p_Var4;
    operator-(&local_48,&local_90,&local_a8);
    Vector<double,_3U>::Vector(&local_78,&local_48);
    Snapshot::wrapVector(this->currSnapshot_,(Vector3d *)&local_78);
    local_108 = local_108 + (double)p_Var8[2]._M_next * 0.5 * local_78.data_[2] * local_78.data_[2];
    local_b8 = -(double)p_Var8[2]._M_next * local_78.data_[2];
    uVar9 = local_f8._12_4_;
    uStack_b0 = 0x8000000000000000;
    local_f8._8_4_ = local_f8._8_4_;
    local_f8._0_8_ = local_f8._0_8_ + local_b8;
    local_f8._12_4_ = uVar9;
    ppSVar5 = (pMVar1->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar5 !=
        (pMVar1->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00144264;
    pSVar6 = (StuntDouble *)0x0;
    while (pSVar6 != (StuntDouble *)0x0) {
      dVar2 = pSVar6->mass_ * local_b8;
      local_d0.data_[2] = Molecule::getMass(pMVar1);
      local_d0.data_[2] = dVar2 / local_d0.data_[2];
      StuntDouble::addFrc(pSVar6,(Vector3d *)&local_d0);
      ppSVar5 = ppSVar5 + 1;
      pSVar6 = (StuntDouble *)0x0;
      if (ppSVar5 !=
          (pMVar1->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_00144264:
        pSVar6 = *ppSVar5;
      }
    }
  }
  RVar3 = Snapshot::getRestraintPotential(this->currSnapshot_);
  Snapshot::setRestraintPotential(this->currSnapshot_,RVar3 + local_108);
  Snapshot::setPotentialEnergy(this->currSnapshot_,rp + local_108);
  for (ppMVar7 = (this->unzconsMols_).
                 super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppMVar7 !=
      (this->unzconsMols_).
      super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppMVar7 = ppMVar7 + 1) {
    pMVar1 = *ppMVar7;
    local_d0.data_[2] = getHFOfUnconsMols(this,pMVar1,local_f8._0_8_);
    ppSVar5 = (pMVar1->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar5 !=
        (pMVar1->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001442fb;
    pSVar6 = (StuntDouble *)0x0;
    while (pSVar6 != (StuntDouble *)0x0) {
      StuntDouble::addFrc(pSVar6,(Vector3d *)&local_d0);
      ppSVar5 = ppSVar5 + 1;
      pSVar6 = (StuntDouble *)0x0;
      if (ppSVar5 !=
          (pMVar1->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001442fb:
        pSVar6 = *ppSVar5;
      }
    }
  }
  return;
}

Assistant:

void ZConstraintForceModifier::doHarmonic() {
    RealType totalFZ(0.0);
    Vector3d force(0.0);
    Vector3d com;
    RealType restPot(0.0);
    std::list<ZconstraintMol>::iterator i;
    StuntDouble* sd;
    Molecule::IntegrableObjectIterator ii;
    Molecule* mol;

    RealType pe = currSnapshot_->getPotentialEnergy();
    currSnapshot_->setRawPotential(pe);

    for (i = movingZMols_.begin(); i != movingZMols_.end(); ++i) {
      mol             = i->mol;
      Vector3d com    = mol->getCom();
      RealType resPos = usingSMD_ ? i->cantPos : i->param.zTargetPos;
      Vector3d d      = com - Vector3d(0.0, 0.0, resPos);
      currSnapshot_->wrapVector(d);

      RealType diff = d[whichDirection];

      restPot += 0.5 * i->param.kz * diff * diff;

      RealType harmonicF = -(i->param.kz * diff);
      totalFZ += harmonicF;

      // adjust force
      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        force[whichDirection] = getHFOfFixedZMols(mol, sd, harmonicF);
        sd->addFrc(force);
      }
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &restPot, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &totalFZ, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    RealType rp = currSnapshot_->getRestraintPotential();
    currSnapshot_->setRestraintPotential(rp + restPot);

    currSnapshot_->setPotentialEnergy(pe + restPot);

    // modify the forces of unconstrained molecules
    std::vector<Molecule*>::iterator j;
    for (j = unzconsMols_.begin(); j != unzconsMols_.end(); ++j) {
      mol                   = *j;
      force[whichDirection] = getHFOfUnconsMols(mol, totalFZ);

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        sd->addFrc(force);
      }
    }
  }